

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PECommander.h
# Opt level: O2

void __thiscall
WrapperInfoCommand::execute(WrapperInfoCommand *this,CmdParams *params,CmdContext *context)

{
  PEFile *pe;
  size_t sVar1;
  ResourcesContainer *pRVar2;
  ostream *poVar3;
  size_t wrapperId;
  long lVar4;
  allocator<char> local_39;
  string local_38;
  
  pe = cmd_util::getPEFromContext(context);
  if ((pe != (PEFile *)0x0) && (pe->album != (ResourcesAlbum *)0x0)) {
    if ((pe->album->allLeafs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"No resources!");
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
    cmd_util::printResourceTypes(pe);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"wrapper type",&local_39)
    ;
    sVar1 = cmd_util::readNumber(&local_38,false);
    std::__cxx11::string::~string((string *)&local_38);
    pRVar2 = PEFile::getResourcesOfType(pe,(resource_type)sVar1);
    if (pRVar2 == (ResourcesContainer *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"No such resource type!");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      lVar4 = (long)(pRVar2->wrappers).
                    super__Vector_base<ResourceContentWrapper_*,_std::allocator<ResourceContentWrapper_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pRVar2->wrappers).
                    super__Vector_base<ResourceContentWrapper_*,_std::allocator<ResourceContentWrapper_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      if (lVar4 != 0) {
        if (lVar4 == 1) {
          wrapperId = 0;
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,"Wrappers count: ");
          *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
               *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"wrapperIndex",&local_39);
          wrapperId = cmd_util::readNumber(&local_38,false);
          std::__cxx11::string::~string((string *)&local_38);
        }
        cmd_util::dumpResourcesInfo(pe,(resource_type)sVar1,wrapperId);
      }
    }
  }
  return;
}

Assistant:

virtual void execute(CmdParams *params, CmdContext  *context)
    {
        PEFile *pe = cmd_util::getPEFromContext(context);
        if (!pe) return;

        ResourcesAlbum *album = pe->getResourcesAlbum();
        if (album == NULL) return;

        size_t dirsCount =  album->dirsCount();
        if (dirsCount == 0) {
            std::cout << "No resources!" << std::endl;
            return;
        }
        cmd_util::printResourceTypes(pe);

        pe::resource_type type = (pe::resource_type) cmd_util::readNumber("wrapper type");

        ResourcesContainer* wrappers = pe->getResourcesOfType(type);
        if (wrappers == NULL) {
            std::cout << "No such resource type!" << std::endl;
            return;
        }
        size_t wrappersCount = wrappers->count();
        if (wrappersCount == 0) {
            return;
        }
        size_t wrapperIndx = 0;
        if (wrappersCount > 1) {
            std::cout << "Wrappers count: " << std::dec << wrappersCount << std::endl;
            wrapperIndx = cmd_util::readNumber("wrapperIndex");
        }
        cmd_util::dumpResourcesInfo(pe, type, wrapperIndx);
    }